

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex2.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  ostream *poVar1;
  char **in_RSI;
  int in_EDI;
  Error error;
  Argengine ae;
  anon_class_1_0_00000001 *in_stack_fffffffffffffc68;
  function<void_()> *in_stack_fffffffffffffc70;
  allocator<char> *in_stack_fffffffffffffc90;
  char *in_stack_fffffffffffffc98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffca0;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffca8;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffcb0;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffcb8;
  string *local_308;
  string *local_2c8;
  string *local_290;
  int local_260;
  string local_258 [37];
  undefined1 local_233;
  allocator<char> local_232;
  allocator<char> local_231;
  string *local_230;
  string local_228 [32];
  undefined1 local_208 [32];
  string *local_1e8;
  undefined8 local_1e0;
  undefined1 local_1d8 [55];
  allocator<char> local_1a1;
  string local_1a0 [40];
  undefined1 local_178 [38];
  undefined1 local_152;
  allocator<char> local_151;
  string *local_150;
  string local_148 [32];
  string *local_128;
  undefined8 local_120;
  undefined1 local_118 [55];
  allocator<char> local_e1;
  string local_e0 [40];
  undefined1 local_b8 [35];
  undefined1 local_95;
  allocator<char> local_81;
  string *local_80;
  string local_78 [32];
  string *local_58;
  undefined8 local_50;
  undefined1 local_48 [48];
  uint local_4;
  
  local_4 = 0;
  juzzlin::Argengine::Argengine((Argengine *)&stack0xffffffffffffffe8,in_EDI,in_RSI,true);
  local_95 = 1;
  local_80 = local_78;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffca0,in_stack_fffffffffffffc98,in_stack_fffffffffffffc90);
  local_95 = 0;
  local_58 = local_78;
  local_50 = 1;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x1054ce);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(in_stack_fffffffffffffcb0,in_stack_fffffffffffffcb8,in_stack_fffffffffffffca8,
        (allocator_type *)in_stack_fffffffffffffca0);
  std::function<void()>::function<main::__0,void>
            (in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffca0,in_stack_fffffffffffffc98,in_stack_fffffffffffffc90);
  juzzlin::Argengine::addOption(&stack0xffffffffffffffe8,local_48,local_b8,0,local_e0);
  std::__cxx11::string::~string(local_e0);
  std::allocator<char>::~allocator(&local_e1);
  std::function<void_()>::~function((function<void_()> *)0x105595);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x1055a2);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x1055af);
  local_290 = (string *)&local_58;
  do {
    local_290 = local_290 + -0x20;
    std::__cxx11::string::~string(local_290);
  } while (local_290 != local_78);
  std::allocator<char>::~allocator(&local_81);
  local_152 = 1;
  local_150 = local_148;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffca0,in_stack_fffffffffffffc98,in_stack_fffffffffffffc90);
  local_152 = 0;
  local_128 = local_148;
  local_120 = 1;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x10569a);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(in_stack_fffffffffffffcb0,in_stack_fffffffffffffcb8,in_stack_fffffffffffffca8,
        (allocator_type *)in_stack_fffffffffffffca0);
  std::function<void()>::function<main::__1,void>
            (in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffca0,in_stack_fffffffffffffc98,in_stack_fffffffffffffc90);
  juzzlin::Argengine::addOption(&stack0xffffffffffffffe8,local_118,local_178,0,local_1a0);
  std::__cxx11::string::~string(local_1a0);
  std::allocator<char>::~allocator(&local_1a1);
  std::function<void_()>::~function((function<void_()> *)0x105761);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x10576e);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x10577b);
  local_2c8 = (string *)&local_128;
  do {
    local_2c8 = local_2c8 + -0x20;
    std::__cxx11::string::~string(local_2c8);
  } while (local_2c8 != local_148);
  std::allocator<char>::~allocator(&local_151);
  local_233 = 1;
  local_230 = local_228;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffca0,in_stack_fffffffffffffc98,in_stack_fffffffffffffc90);
  local_230 = (string *)local_208;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffca0,in_stack_fffffffffffffc98,in_stack_fffffffffffffc90);
  local_233 = 0;
  local_1e8 = local_228;
  local_1e0 = 2;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x1058b1);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(in_stack_fffffffffffffcb0,in_stack_fffffffffffffcb8,in_stack_fffffffffffffca8,
        (allocator_type *)in_stack_fffffffffffffca0);
  juzzlin::Argengine::addConflictingOptions(&stack0xffffffffffffffe8,local_1d8);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x105904);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x105911);
  local_308 = (string *)&local_1e8;
  do {
    local_308 = local_308 + -0x20;
    std::__cxx11::string::~string(local_308);
  } while (local_308 != local_228);
  std::allocator<char>::~allocator(&local_232);
  std::allocator<char>::~allocator(&local_231);
  juzzlin::Argengine::Error::Error((Error *)0x105992);
  juzzlin::Argengine::parse((Error *)&stack0xffffffffffffffe8);
  if (local_260 != 0) {
    poVar1 = std::operator<<((ostream *)&std::cerr,local_258);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    juzzlin::Argengine::printHelp();
  }
  local_4 = (uint)(local_260 != 0);
  juzzlin::Argengine::Error::~Error((Error *)0x105e0e);
  juzzlin::Argengine::~Argengine((Argengine *)&stack0xffffffffffffffe8);
  return local_4;
}

Assistant:

int main(int argc, char ** argv)
{
    // Instantiate Argengine and give it the raw argument data.
    Argengine ae(argc, argv);

    // Add a minimal dummy option "foo".
    ae.addOption(
      { "foo" }, [] {
          std::cout << "Foo enabled!" << std::endl;
      });

    // Add a minimal dummy option "bar".
    ae.addOption(
      { "bar" }, [] {
          std::cout << "Bar enabled!" << std::endl;
      });

    // Set "foo" and "bar" as conflicting options.
    ae.addConflictingOptions({ "foo", "bar" });

    // Parse the arguments and store possible error to variable error.
    Argengine::Error error;
    ae.parse(error);

    // Check error and print the possible error message.
    if (error.code != Argengine::Error::Code::Ok) {
        std::cerr << error.message << std::endl
                  << std::endl;
        ae.printHelp(); // Print the auto-generated help.
        return EXIT_FAILURE;
    }

    return EXIT_SUCCESS;
}